

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adj_matrix_graph.c
# Opt level: O1

MatrixGraph newEmptyMatrixGraph(int countOfVertex,int countOfEdge)

{
  ulong uVar1;
  MatrixGraph pAVar2;
  VertexType *pVVar3;
  int **ppiVar4;
  int *piVar5;
  int j;
  ulong uVar6;
  size_t __size;
  ulong uVar7;
  
  uVar1 = (ulong)(uint)countOfVertex;
  pAVar2 = (MatrixGraph)malloc(0x20);
  if (pAVar2 == (MatrixGraph)0x0) {
    __assert_fail("matrixGraph",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/determinelcl[P]data-structure/graph/adj_matrix_graph.c"
                  ,0x3c,"MatrixGraph newEmptyMatrixGraph(int, int)");
  }
  __size = (size_t)countOfVertex;
  pVVar3 = (VertexType *)malloc(__size);
  pAVar2->vertex = pVVar3;
  ppiVar4 = (int **)malloc(__size * 8);
  pAVar2->matrix = ppiVar4;
  if (ppiVar4 != (int **)0x0) {
    if (0 < countOfVertex) {
      uVar7 = 0;
      do {
        piVar5 = (int *)malloc(__size << 2);
        ppiVar4[uVar7] = piVar5;
        if (piVar5 == (int *)0x0) {
          __assert_fail("matrixGraph->matrix[i]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/determinelcl[P]data-structure/graph/adj_matrix_graph.c"
                        ,0x43,"MatrixGraph newEmptyMatrixGraph(int, int)");
        }
        uVar7 = uVar7 + 1;
      } while (uVar1 != uVar7);
    }
    pAVar2->vexNum = countOfVertex;
    pAVar2->edgeNum = countOfEdge;
    if (0 < countOfVertex) {
      uVar7 = 0;
      do {
        piVar5 = ppiVar4[uVar7];
        uVar6 = 0;
        do {
          piVar5[uVar6] = 0x7fff;
          uVar6 = uVar6 + 1;
        } while (uVar1 != uVar6);
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar1);
    }
    return pAVar2;
  }
  __assert_fail("matrixGraph->matrix",
                "/workspace/llm4binary/github/license_all_cmakelists_25/determinelcl[P]data-structure/graph/adj_matrix_graph.c"
                ,0x40,"MatrixGraph newEmptyMatrixGraph(int, int)");
}

Assistant:

MatrixGraph newEmptyMatrixGraph(int countOfVertex, int countOfEdge) {
    MatrixGraph matrixGraph = malloc(sizeof(struct AMG));
    assert(matrixGraph);

    matrixGraph->vertex = malloc(sizeof(VertexType) * countOfVertex);
    matrixGraph->matrix = malloc(sizeof(int *) * countOfVertex);
    assert(matrixGraph->matrix);
    for (int i = 0; i < countOfVertex; ++i) {
        matrixGraph->matrix[i] = malloc(sizeof(int) * countOfVertex);
        assert(matrixGraph->matrix[i]);
    }


    matrixGraph->vexNum = countOfVertex;
    matrixGraph->edgeNum = countOfEdge;

    // 初始化矩阵
    for (int i = 0; i < countOfVertex; ++i) {
        for (int j = 0; j < countOfVertex; ++j) {
            matrixGraph->matrix[i][j] = UNFLAG_WEIGHT_GRAPH;
        }
    }

    return matrixGraph;
}